

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O0

int stack_5_3::test_stack(void)

{
  code *pcVar1;
  long lVar2;
  int local_28;
  int local_24;
  int j;
  int i;
  sq_stack s;
  
  init((EVP_PKEY_CTX *)&j);
  for (local_24 = 0; local_24 < 6; local_24 = local_24 + 1) {
    s.data._0_4_ = (int)s.data + 1;
    *(int *)(_j + (long)(int)s.data * 4) = local_24;
  }
  for (local_28 = 0; local_28 < 6; local_28 = local_28 + 1) {
    lVar2 = (long)(int)s.data;
    s.data._0_4_ = (int)s.data + -1;
    printf("%d \t",(ulong)*(uint *)(_j + lVar2 * 4));
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

int test_stack() {
        sq_stack s;
        init(s);
        for (int i = 0; i < 6; i++) {
            s.data[++s.top] = i;
        }
        for (int j = 0; j < 6; j++) {
            printf("%d \t", s.data[s.top--]);
        }

    }